

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::InitializeUpdateData<duckdb::uhugeint_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 *puVar6;
  idx_t i_1;
  ulong uVar7;
  ulong uVar8;
  ulong row_idx;
  
  pdVar2 = update->data;
  uVar1 = update_info->N;
  puVar6 = (undefined8 *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
    uVar8 = uVar7;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar8 = (ulong)sel->sel_vector[uVar7];
    }
    psVar3 = update->sel->sel_vector;
    if (psVar3 != (sel_t *)0x0) {
      uVar8 = (ulong)psVar3[uVar8];
    }
    uVar4 = *(undefined8 *)(pdVar2 + uVar8 * 0x10 + 8);
    *puVar6 = *(undefined8 *)(pdVar2 + uVar8 * 0x10);
    puVar6[1] = uVar4;
    puVar6 = puVar6 + 2;
  }
  pdVar2 = base_data->data;
  FlatVector::VerifyFlatVector(base_data);
  uVar8 = (ulong)base_info->max;
  for (uVar7 = 0; uVar7 < base_info->N; uVar7 = uVar7 + 1) {
    row_idx = (ulong)*(uint *)((long)&base_info[1].segment + uVar7 * 4);
    bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(base_data->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar5) {
      uVar4 = *(undefined8 *)(pdVar2 + row_idx * 0x10 + 8);
      puVar6 = (undefined8 *)((long)&base_info[1].segment + uVar8 * 4);
      *puVar6 = *(undefined8 *)(pdVar2 + row_idx * 0x10);
      puVar6[1] = uVar4;
    }
    uVar8 = uVar8 + 4;
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}